

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O3

int __thiscall duckdb::Linenoise::CompleteLine(Linenoise *this,EscapeSequence *current_sequence)

{
  pointer pcVar1;
  char *__s;
  size_t __maxlen;
  bool bVar2;
  char cVar3;
  bool bVar4;
  EscapeSequence EVar5;
  int iVar6;
  reference pvVar7;
  ssize_t sVar8;
  long lVar9;
  ulong __n;
  int iVar10;
  Linenoise *pLVar11;
  undefined1 **ppuVar12;
  byte bVar13;
  char c;
  TabCompletion completion_list;
  Linenoise saved;
  char local_10d;
  uint local_10c;
  TabCompletion local_108;
  EscapeSequence *local_f0;
  vector<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_> *local_e8;
  vector<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_> *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  undefined1 local_c8 [24];
  size_t local_b0;
  size_t local_a0;
  undefined4 local_78;
  undefined2 local_74;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  vector<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_> local_50;
  size_t local_38;
  
  bVar13 = 0;
  local_10d = '\0';
  local_f0 = current_sequence;
  TabComplete(&local_108,this);
  if (local_108.completions.super_vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>.
      super__Vector_base<duckdb::Completion,_std::allocator<duckdb::Completion>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_108.completions.super_vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>.
      super__Vector_base<duckdb::Completion,_std::allocator<duckdb::Completion>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar10 = 0;
    Terminal::Beep();
  }
  else {
    local_e8 = &local_50;
    local_e0 = &this->search_matches;
    __n = 0;
    local_10c = 0;
    bVar2 = false;
    do {
      if (__n < (ulong)(((long)local_108.completions.
                               super_vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>
                               .
                               super__Vector_base<duckdb::Completion,_std::allocator<duckdb::Completion>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_108.completions.
                               super_vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>
                               .
                               super__Vector_base<duckdb::Completion,_std::allocator<duckdb::Completion>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333
                       )) {
        pLVar11 = this;
        ppuVar12 = &local_d8;
        for (lVar9 = 0xc; lVar9 != 0; lVar9 = lVar9 + -1) {
          *ppuVar12 = *(undefined1 **)pLVar11;
          pLVar11 = (Linenoise *)((long)pLVar11 + (ulong)bVar13 * -0x10 + 8);
          ppuVar12 = ppuVar12 + (ulong)bVar13 * -2 + 1;
        }
        local_74._0_1_ = this->has_more_data;
        local_74._1_1_ = this->insert;
        local_78._0_1_ = this->clear_screen;
        local_78._1_1_ = this->continuation_markers;
        local_78._2_1_ = this->search;
        local_78._3_1_ = this->render;
        pcVar1 = (this->search_buf)._M_dataplus._M_p;
        local_70[0] = local_60;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_70,pcVar1,pcVar1 + (this->search_buf)._M_string_length);
        ::std::vector<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>::vector
                  (local_e8,local_e0);
        local_38 = this->search_index;
        pvVar7 = vector<duckdb::Completion,_true>::operator[](&local_108.completions,__n);
        this->len = (pvVar7->completion)._M_string_length;
        pvVar7 = vector<duckdb::Completion,_true>::operator[](&local_108.completions,__n);
        this->pos = pvVar7->cursor_pos;
        pvVar7 = vector<duckdb::Completion,_true>::operator[](&local_108.completions,__n);
        this->buf = (pvVar7->completion)._M_dataplus._M_p;
        RefreshLine(this);
        this->len = local_a0;
        this->pos = local_b0;
        this->buf = local_d0;
        if (local_50.super__Vector_base<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50.
                          super__Vector_base<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_70[0] != local_60) {
          operator_delete(local_70[0]);
        }
      }
      else {
        RefreshLine(this);
      }
      sVar8 = ::read(this->ifd,&local_10d,1);
      if ((int)sVar8 < 1) {
        iVar10 = -1;
        break;
      }
      local_d8 = local_c8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,"\nComplete Character %d\n","");
      cVar3 = local_10d;
      iVar10 = (int)local_10d;
      if (local_d8 != local_c8) {
        operator_delete(local_d8);
      }
      if (cVar3 == '\t') {
        __n = (__n + 1) %
              (ulong)(((long)local_108.completions.
                             super_vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>.
                             super__Vector_base<duckdb::Completion,_std::allocator<duckdb::Completion>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_108.completions.
                             super_vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>.
                             super__Vector_base<duckdb::Completion,_std::allocator<duckdb::Completion>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333);
LAB_002134ba:
        if (bVar2) {
LAB_002134ee:
          bVar4 = bVar2;
          if ((local_10c & 1) != 0) goto LAB_002134f8;
          local_10c = 0;
        }
      }
      else {
        bVar4 = true;
        if (cVar3 == '\x1b') {
          EVar5 = Terminal::ReadEscapeSequence(this->ifd);
          if (EVar5 == SHIFT_TAB) {
            if (__n != 0) {
              __n = __n - 1;
              goto LAB_002134ba;
            }
            RefreshLine(this);
            __n = 0;
          }
          else {
            if (EVar5 != ESCAPE) {
              *local_f0 = EVar5;
              goto LAB_002134f8;
            }
            RefreshLine(this);
          }
          *local_f0 = EVar5;
          bVar2 = true;
          goto LAB_002134ee;
        }
LAB_002134f8:
        bVar2 = bVar4;
        local_10c = 0xcccccc01;
        if (__n < (ulong)(((long)local_108.completions.
                                 super_vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>
                                 .
                                 super__Vector_base<duckdb::Completion,_std::allocator<duckdb::Completion>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_108.completions.
                                 super_vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>
                                 .
                                 super__Vector_base<duckdb::Completion,_std::allocator<duckdb::Completion>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x3333333333333333)) {
          __s = this->buf;
          __maxlen = this->buflen;
          pvVar7 = vector<duckdb::Completion,_true>::operator[](&local_108.completions,__n);
          iVar6 = snprintf(__s,__maxlen,"%s",(pvVar7->completion)._M_dataplus._M_p);
          pvVar7 = vector<duckdb::Completion,_true>::operator[](&local_108.completions,__n);
          this->pos = pvVar7->cursor_pos;
          this->len = (long)iVar6;
        }
      }
    } while (!bVar2);
  }
  ::std::vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>::~vector
            ((vector<duckdb::Completion,_std::allocator<duckdb::Completion>_> *)&local_108);
  return iVar10;
}

Assistant:

int Linenoise::CompleteLine(EscapeSequence &current_sequence) {
	int nread, nwritten;
	char c = 0;

	auto completion_list = TabComplete();
	auto &completions = completion_list.completions;
	if (completions.empty()) {
		Terminal::Beep();
	} else {
		bool stop = false;
		bool accept_completion = false;
		idx_t i = 0;

		while (!stop) {
			/* Show completion or original buffer */
			if (i < completions.size()) {
				Linenoise saved = *this;

				len = completions[i].completion.size();
				pos = completions[i].cursor_pos;
				buf = (char *)completions[i].completion.c_str();
				RefreshLine();
				len = saved.len;
				pos = saved.pos;
				buf = saved.buf;
			} else {
				RefreshLine();
			}

			nread = read(ifd, &c, 1);
			if (nread <= 0) {
				return -1;
			}

			Linenoise::Log("\nComplete Character %d\n", (int)c);
			switch (c) {
			case TAB: /* tab */
				i = (i + 1) % completions.size();
				break;
			case ESC: { /* escape */
				auto escape = Terminal::ReadEscapeSequence(ifd);
				switch (escape) {
				case EscapeSequence::SHIFT_TAB:
					// shift-tab: move backwards
					if (i == 0) {
						// pressing shift-tab at the first completion cancels completion
						RefreshLine();
						current_sequence = escape;
						stop = true;
					} else {
						i--;
					}
					break;
				case EscapeSequence::ESCAPE:
					/* Re-show original buffer */
					RefreshLine();
					current_sequence = escape;
					stop = true;
					break;
				default:
					current_sequence = escape;
					accept_completion = true;
					stop = true;
					break;
				}
				break;
			}
			default:
				accept_completion = true;
				stop = true;
				break;
			}
			if (stop && accept_completion && i < completions.size()) {
				/* Update buffer and return */
				if (i < completions.size()) {
					nwritten = snprintf(buf, buflen, "%s", completions[i].completion.c_str());
					pos = completions[i].cursor_pos;
					len = nwritten;
				}
			}
		}
	}
	return c; /* Return last read character */
}